

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# random.h
# Opt level: O0

FeatureOptions<wasm::SIMDExtractOp> * __thiscall
wasm::Random::FeatureOptions<wasm::SIMDExtractOp>::add<>
          (FeatureOptions<wasm::SIMDExtractOp> *this,FeatureSet feature,SIMDExtractOp option)

{
  mapped_type *this_00;
  FeatureOptions<wasm::SIMDExtractOp> *pFVar1;
  SIMDExtractOp local_1c;
  FeatureOptions<wasm::SIMDExtractOp> *pFStack_18;
  SIMDExtractOp option_local;
  FeatureOptions<wasm::SIMDExtractOp> *this_local;
  FeatureSet feature_local;
  
  local_1c = option;
  pFStack_18 = this;
  this_local._4_4_ = feature.features;
  this_00 = std::
            map<wasm::FeatureSet,_std::vector<wasm::SIMDExtractOp,_std::allocator<wasm::SIMDExtractOp>_>,_std::less<wasm::FeatureSet>,_std::allocator<std::pair<const_wasm::FeatureSet,_std::vector<wasm::SIMDExtractOp,_std::allocator<wasm::SIMDExtractOp>_>_>_>_>
            ::operator[](&this->options,(key_type *)((long)&this_local + 4));
  std::vector<wasm::SIMDExtractOp,_std::allocator<wasm::SIMDExtractOp>_>::push_back
            (this_00,&local_1c);
  pFVar1 = add(this,this_local._4_4_);
  return pFVar1;
}

Assistant:

FeatureOptions<T>& add(FeatureSet feature, T option, Ts... rest) {
      options[feature].push_back(option);
      return add(feature, rest...);
    }